

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

uint8 * __thiscall
caffe::ConvolutionParameter::InternalSerializeWithCachedSizesToArray
          (ConvolutionParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  bool bVar2;
  uint32 uVar3;
  ConvolutionParameter_Engine value;
  int32 value_00;
  uint8 *target_00;
  UnknownFieldSet *unknown_fields;
  uint8 *puStack_40;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  ConvolutionParameter *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  puStack_40 = target;
  if ((uVar1 & 4) != 0) {
    uVar3 = num_output(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(1,uVar3,target);
  }
  if ((uVar1 & 0x1000) != 0) {
    bVar2 = bias_term(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteBoolToArray(2,bVar2,puStack_40);
  }
  target_00 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                        (3,&this->pad_,puStack_40);
  puStack_40 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                         (4,&this->kernel_size_,target_00);
  if ((uVar1 & 0x2000) != 0) {
    uVar3 = group(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(5,uVar3,puStack_40);
  }
  puStack_40 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                         (6,&this->stride_,puStack_40);
  if ((uVar1 & 1) != 0) {
    puStack_40 = google::protobuf::internal::WireFormatLite::
                 InternalWriteMessageNoVirtualToArray<caffe::FillerParameter>
                           (7,this->weight_filler_,deterministic,puStack_40);
  }
  if ((uVar1 & 2) != 0) {
    puStack_40 = google::protobuf::internal::WireFormatLite::
                 InternalWriteMessageNoVirtualToArray<caffe::FillerParameter>
                           (8,this->bias_filler_,deterministic,puStack_40);
  }
  if ((uVar1 & 8) != 0) {
    uVar3 = pad_h(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(9,uVar3,puStack_40);
  }
  if ((uVar1 & 0x10) != 0) {
    uVar3 = pad_w(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(10,uVar3,puStack_40)
    ;
  }
  if ((uVar1 & 0x20) != 0) {
    uVar3 = kernel_h(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                           (0xb,uVar3,puStack_40);
  }
  if ((uVar1 & 0x40) != 0) {
    uVar3 = kernel_w(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                           (0xc,uVar3,puStack_40);
  }
  if ((uVar1 & 0x80) != 0) {
    uVar3 = stride_h(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                           (0xd,uVar3,puStack_40);
  }
  if ((uVar1 & 0x100) != 0) {
    uVar3 = stride_w(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                           (0xe,uVar3,puStack_40);
  }
  if ((uVar1 & 0x200) != 0) {
    value = engine(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteEnumToArray(0xf,value,puStack_40);
  }
  if ((uVar1 & 0x800) != 0) {
    value_00 = axis(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                           (0x10,value_00,puStack_40);
  }
  if ((uVar1 & 0x400) != 0) {
    bVar2 = force_nd_im2col(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteBoolToArray(0x11,bVar2,puStack_40)
    ;
  }
  puStack_40 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                         (0x12,&this->dilation_,puStack_40);
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = ConvolutionParameter::unknown_fields(this);
    puStack_40 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                           (unknown_fields,puStack_40);
  }
  return puStack_40;
}

Assistant:

::google::protobuf::uint8* ConvolutionParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.ConvolutionParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional uint32 num_output = 1;
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(1, this->num_output(), target);
  }

  // optional bool bias_term = 2 [default = true];
  if (cached_has_bits & 0x00001000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(2, this->bias_term(), target);
  }

  // repeated uint32 pad = 3;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(3, this->pad_, target);

  // repeated uint32 kernel_size = 4;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(4, this->kernel_size_, target);

  // optional uint32 group = 5 [default = 1];
  if (cached_has_bits & 0x00002000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(5, this->group(), target);
  }

  // repeated uint32 stride = 6;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(6, this->stride_, target);

  // optional .caffe.FillerParameter weight_filler = 7;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        7, *this->weight_filler_, deterministic, target);
  }

  // optional .caffe.FillerParameter bias_filler = 8;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        8, *this->bias_filler_, deterministic, target);
  }

  // optional uint32 pad_h = 9 [default = 0];
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(9, this->pad_h(), target);
  }

  // optional uint32 pad_w = 10 [default = 0];
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(10, this->pad_w(), target);
  }

  // optional uint32 kernel_h = 11;
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(11, this->kernel_h(), target);
  }

  // optional uint32 kernel_w = 12;
  if (cached_has_bits & 0x00000040u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(12, this->kernel_w(), target);
  }

  // optional uint32 stride_h = 13;
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(13, this->stride_h(), target);
  }

  // optional uint32 stride_w = 14;
  if (cached_has_bits & 0x00000100u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(14, this->stride_w(), target);
  }

  // optional .caffe.ConvolutionParameter.Engine engine = 15 [default = DEFAULT];
  if (cached_has_bits & 0x00000200u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      15, this->engine(), target);
  }

  // optional int32 axis = 16 [default = 1];
  if (cached_has_bits & 0x00000800u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(16, this->axis(), target);
  }

  // optional bool force_nd_im2col = 17 [default = false];
  if (cached_has_bits & 0x00000400u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(17, this->force_nd_im2col(), target);
  }

  // repeated uint32 dilation = 18;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(18, this->dilation_, target);

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.ConvolutionParameter)
  return target;
}